

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

int __thiscall QPDFFormFieldObjectHelper::getFlags(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  int iVar2;
  QPDFObjectHandle f;
  QPDFObjectHandle local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_30._M_pi = &local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"/Ff","");
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)&local_40,(string *)this);
  if (local_30._M_pi != &local_20) {
    operator_delete(local_30._M_pi,(ulong)((long)(_func_int ***)local_20._vptr__Sp_counted_base + 1)
                   );
  }
  bVar1 = QPDFObjectHandle::isInteger(&local_40);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getIntValueAsInt(&local_40);
  }
  if ((element_type *)
      local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return iVar2;
}

Assistant:

int
QPDFFormFieldObjectHelper::getFlags()
{
    QPDFObjectHandle f = getInheritableFieldValue("/Ff");
    return f.isInteger() ? f.getIntValueAsInt() : 0;
}